

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O0

void duckdb::Bit::BitToNumeric<unsigned_char>(bitstring_t bit,uchar *output_num)

{
  bitstring_t *pbVar1;
  uint8_t uVar2;
  char *src;
  const_data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  idx_t iVar5;
  bitstring_t *str;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  idx_t idx;
  idx_t padded_byte_idx;
  data_ptr_t output;
  const_data_ptr_t data;
  string_t *in_stack_ffffffffffffffd0;
  string_t local_10;
  
  *(uchar *)CONCAT71(in_register_00000011,in_DL) = '\0';
  src = string_t::GetData(in_stack_ffffffffffffffd0);
  pdVar3 = const_data_ptr_cast<char>(src);
  pdVar4 = data_ptr_cast<unsigned_char>((uchar *)CONCAT71(in_register_00000011,in_DL));
  iVar5 = string_t::GetSize(&local_10);
  str = (bitstring_t *)(2 - iVar5);
  uVar2 = GetFirstByte(str);
  pdVar4[-(long)str] = uVar2;
  pbVar1 = str;
  while (pbVar1 == (bitstring_t *)0xffffffffffffffff) {
    *pdVar4 = pdVar3[1 - (long)str];
    pbVar1 = (bitstring_t *)0x0;
  }
  return;
}

Assistant:

void Bit::BitToNumeric(bitstring_t bit, T &output_num) {
	D_ASSERT(bit.GetSize() <= sizeof(T) + 1);

	output_num = 0;
	auto data = const_data_ptr_cast(bit.GetData());
	auto output = data_ptr_cast(&output_num);

	idx_t padded_byte_idx = sizeof(T) - bit.GetSize() + 1;
	output[sizeof(T) - 1 - padded_byte_idx] = GetFirstByte(bit);
	for (idx_t idx = padded_byte_idx + 1; idx < sizeof(T); ++idx) {
		output[sizeof(T) - 1 - idx] = data[1 + idx - padded_byte_idx];
	}
}